

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_fixed_point.cpp
# Opt level: O1

void Disa::forward_sweep(Matrix_Sparse *a_matrix,Vector_Dense<double,_0UL> *x_vector,
                        Vector_Dense<double,_0UL> *x_update,Vector_Dense<double,_0UL> *b_vector,
                        Scalar omega)

{
  pointer puVar1;
  pointer puVar2;
  Scalar *pSVar3;
  long lVar4;
  double dVar5;
  const_iterator column_iter;
  double local_b0;
  pointer local_a8;
  Scalar local_a0;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_98;
  size_t local_88;
  matrix_type *local_80;
  double local_78;
  Vector_Dense<double,_0UL> *local_70;
  Vector_Dense<double,_0UL> *local_68;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_60;
  size_t local_50;
  matrix_type *local_48;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_40;
  
  local_a8 = (pointer)0x0;
  puVar1 = (a_matrix->row_non_zero).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (a_matrix->row_non_zero).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)puVar1 - (long)puVar2 != 8 && puVar1 != puVar2) {
    local_78 = 1.0 - omega;
    local_a0 = omega;
    local_70 = x_update;
    local_68 = b_vector;
    do {
      local_60 = Matrix_Sparse::operator[](a_matrix,(size_t *)&local_a8);
      Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::cbegin((const_iterator *)&local_98,&local_60);
      local_b0 = 0.0;
      while( true ) {
        local_40 = Matrix_Sparse::operator[](a_matrix,(size_t *)&local_a8);
        Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::cend((const_iterator *)&local_60,&local_40);
        if ((((local_80 == local_48) && (local_88 == local_50)) &&
            (local_98.matrix == local_60.matrix)) && (local_98.row_index == local_60.row_index))
        break;
        puVar1 = ((local_98.matrix)->row_non_zero).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (puVar1 != local_a8) {
          local_b0 = local_b0 +
                     *(double *)local_98.row_index *
                     (x_vector->super_vector<double,_std::allocator<double>_>).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)puVar1];
        }
        local_98.row_index = (size_t)(local_98.row_index + 8);
        local_98.matrix =
             (Matrix_Sparse *)
             &((local_98.matrix)->row_non_zero).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
      }
      dVar5 = ((local_68->super_vector<double,_std::allocator<double>_>).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[(long)local_a8] - local_b0) * local_a0;
      local_98 = Matrix_Sparse::operator[](a_matrix,(size_t *)&local_a8);
      pSVar3 = Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator[]
                         (&local_98,(size_t *)&local_a8);
      (local_70->super_vector<double,_std::allocator<double>_>).
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [(long)local_a8] =
           (x_vector->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[(long)local_a8] * local_78 + dVar5 / *pSVar3;
      local_a8 = (pointer)((long)local_a8 + 1);
      lVar4 = (long)(a_matrix->row_non_zero).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(a_matrix->row_non_zero).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
    } while ((lVar4 != 0) && (local_a8 < (pointer)((lVar4 >> 3) - 1U)));
  }
  return;
}

Assistant:

inline void forward_sweep(const Matrix_Sparse& a_matrix, const Vector_Dense<Scalar, 0>& x_vector,
                          Vector_Dense<Scalar, 0>& x_update, const Vector_Dense<Scalar, 0>& b_vector,
                          const Scalar omega = 1) {
  // forward sweep
  FOR(i_row, a_matrix.size_row()) {
    Scalar offs_row_dot = 0;
    FOR_ITER(column_iter, a_matrix[i_row])
    if(column_iter.i_column() != i_row) offs_row_dot += *column_iter * x_vector[column_iter.i_column()];
    x_update[i_row] =
    omega * (b_vector[i_row] - offs_row_dot) / a_matrix[i_row][i_row] + (1.0 - omega) * x_vector[i_row];
  }
}